

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead128a.c
# Opt level: O0

void ascon_aead128a_assoc_data_update
               (ascon_aead_ctx_t *ctx,uint8_t *assoc_data,size_t assoc_data_len)

{
  long in_RDX;
  long in_RDI;
  uint8_t *in_stack_00000018;
  ascon_bufstate_t *in_stack_00000020;
  
  if (in_RDX != 0) {
    *(undefined1 *)(in_RDI + 0x39) = 8;
    buffered_accumulation
              (in_stack_00000020,in_stack_00000018,(uint8_t *)ctx,(absorb_fptr)assoc_data,
               assoc_data_len,(uint8_t)((ulong)in_RDI >> 0x38));
  }
  return;
}

Assistant:

ASCON_API void
ascon_aead128a_assoc_data_update(ascon_aead_ctx_t* const ctx,
                                 const uint8_t* assoc_data,
                                 size_t assoc_data_len)
{
    ASCON_ASSERT(ctx != NULL);
    ASCON_ASSERT(assoc_data_len == 0 || assoc_data != NULL);
    ASCON_ASSERT(ctx->bufstate.flow_state == ASCON_FLOW_AEAD128a_INITIALISED
                 || ctx->bufstate.flow_state == ASCON_FLOW_AEAD128a_ASSOC_DATA_UPDATED);
    if (assoc_data_len > 0)
    {
        ctx->bufstate.flow_state = ASCON_FLOW_AEAD128a_ASSOC_DATA_UPDATED;
        buffered_accumulation(&ctx->bufstate, NULL, assoc_data,
                              absorb_assoc_data, assoc_data_len,
                              ASCON_DOUBLE_RATE);
    }
}